

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPizCompressor.cpp
# Opt level: O1

int __thiscall
Imf_2_5::PizCompressor::uncompress
          (PizCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  long *plVar1;
  bool bVar2;
  size_t __n;
  ushort uVar3;
  int i;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  const_iterator cVar10;
  const_iterator cVar11;
  ConstIterator CVar12;
  ushort *puVar13;
  InputExc *pIVar14;
  uint b;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  unsigned_short *puVar18;
  ushort *puVar19;
  long lVar20;
  ChannelData *pCVar21;
  ushort *__src;
  char *pcVar22;
  long lVar23;
  unsigned_short local_62;
  unsigned_short *local_60;
  ushort *local_58;
  void *local_50;
  ulong local_48;
  int local_3c;
  char **local_38;
  
  if (inSize == 0) {
    *outPtr = this->_outBuffer;
    return 0;
  }
  iVar8 = (range->min).x;
  uVar15 = (ulong)(uint)(range->min).y;
  iVar4 = (range->max).x;
  uVar6 = (range->max).y;
  b = this->_maxY;
  if ((int)uVar6 < this->_maxY) {
    b = uVar6;
  }
  iVar5 = this->_maxX;
  if (iVar4 < this->_maxX) {
    iVar5 = iVar4;
  }
  puVar18 = this->_tmpBuffer;
  local_58 = (ushort *)inPtr;
  local_3c = inSize;
  local_38 = outPtr;
  cVar10._M_node = (_Base_ptr)ChannelList::begin(this->_channels);
  cVar11._M_node = (_Base_ptr)ChannelList::end(this->_channels);
  local_48 = uVar15;
  if (cVar10._M_node != cVar11._M_node) {
    local_60 = (unsigned_short *)CONCAT44(local_60._4_4_,iVar5);
    lVar23 = 0x1c;
    do {
      pCVar21 = this->_channelData;
      *(unsigned_short **)((long)pCVar21 + lVar23 + -0x1c) = puVar18;
      *(unsigned_short **)((long)pCVar21 + lVar23 + -0x14) = puVar18;
      iVar4 = numSamples(*(int *)&cVar10._M_node[9].field_0x4,iVar8,(int)local_60);
      *(int *)((long)pCVar21 + lVar23 + -0xc) = iVar4;
      iVar4 = numSamples(*(int *)&cVar10._M_node[9]._M_parent,(int)uVar15,b);
      *(int *)((long)pCVar21 + lVar23 + -8) = iVar4;
      *(undefined4 *)((long)pCVar21 + lVar23 + -4) = *(undefined4 *)&cVar10._M_node[9]._M_parent;
      iVar4 = pixelTypeSize(cVar10._M_node[9]._M_color);
      iVar5 = pixelTypeSize(HALF);
      uVar15 = local_48;
      *(int *)((long)&pCVar21->start + lVar23) = iVar4 / iVar5;
      puVar18 = puVar18 + (iVar4 / iVar5) * *(int *)((long)pCVar21 + lVar23 + -0xc) *
                          *(int *)((long)pCVar21 + lVar23 + -8);
      cVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar10._M_node);
      CVar12 = ChannelList::end(this->_channels);
      lVar23 = lVar23 + 0x20;
    } while ((const_iterator)cVar10._M_node != CVar12._i._M_node);
  }
  local_50 = operator_new__(0x2000);
  memset(local_50,0,0x2000);
  iVar8 = local_3c;
  puVar13 = local_58;
  if (local_3c < 4) {
    pcVar16 = "PIZ compressed data too short";
  }
  else {
    local_60 = puVar18;
    if (*(byte *)((long)local_58 + 3) < 0x20) {
      puVar19 = (ushort *)((long)local_3c + (long)local_58);
      iVar4 = (uint)*(byte *)((long)local_58 + 1) * 0x100 + (uint)(byte)*local_58;
      __src = local_58 + 2;
      uVar3 = CONCAT11(*(byte *)((long)local_58 + 3),(byte)local_58[1]);
      if ((ushort)iVar4 <= uVar3) {
        uVar6 = (uint)uVar3 - iVar4;
        if (puVar19 < (ushort *)((long)__src + (long)(int)uVar6 + 1)) {
          pIVar14 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::InputExc::InputExc(pIVar14,"PIZ compressed data too short");
          __cxa_throw(pIVar14,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
        }
        if (uVar6 != 0xffffffff) {
          memcpy((void *)((long)local_50 + (ulong)*local_58),__src,(ulong)uVar6 + 1);
          __src = (ushort *)((long)puVar13 + (ulong)uVar6 + 5);
        }
      }
      puVar13 = (ushort *)operator_new__(0x20000);
      iVar4 = 0;
      memset(puVar13,0,0x20000);
      uVar6 = 0;
      do {
        if ((uVar6 == 0) ||
           ((*(byte *)((long)local_50 + (ulong)(uVar6 >> 3)) >> (uVar6 & 7) & 1) != 0)) {
          lVar23 = (long)iVar4;
          iVar4 = iVar4 + 1;
          *(short *)((long)puVar13 + lVar23 * 2) = (short)uVar6;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != 0x10000);
      if (iVar4 < 0x10000) {
        memset((void *)((long)puVar13 + (long)iVar4 * 2),0,(ulong)(0xffff - iVar4) * 2 + 2);
      }
      local_58 = puVar13;
      if (puVar19 < __src + 2) {
        pIVar14 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar14,"PIZ compressed data too short");
        __cxa_throw(pIVar14,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      if (iVar8 < *(int *)__src) {
        pIVar14 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc
                  (pIVar14,"Error in header for PIZ-compressed data (invalid array length).");
        __cxa_throw(pIVar14,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      hufUncompress((char *)(__src + 2),*(int *)__src,this->_tmpBuffer,
                    (int)((ulong)((long)local_60 - (long)this->_tmpBuffer) >> 1));
      if (0 < this->_numChans) {
        lVar23 = 0;
        do {
          uVar6 = this->_channelData[lVar23].size;
          uVar15 = (ulong)uVar6;
          if (0 < (int)uVar6) {
            pCVar21 = this->_channelData + lVar23;
            lVar20 = 0;
            lVar17 = 0;
            do {
              wav2Decode((unsigned_short *)((long)pCVar21->start + lVar20),pCVar21->nx,(int)uVar15,
                         pCVar21->ny,pCVar21->nx * (int)uVar15,(short)iVar4 - 1);
              lVar17 = lVar17 + 1;
              uVar15 = (ulong)pCVar21->size;
              lVar20 = lVar20 + 2;
            } while (lVar17 < (long)uVar15);
          }
          lVar23 = lVar23 + 1;
          puVar13 = local_58;
        } while (lVar23 < this->_numChans);
      }
      puVar18 = this->_tmpBuffer;
      uVar6 = (uint)((ulong)((long)local_60 - (long)puVar18) >> 1);
      if (0 < (int)uVar6) {
        uVar15 = 0;
        do {
          puVar18[uVar15] = *(unsigned_short *)((long)puVar13 + (ulong)puVar18[uVar15] * 2);
          uVar15 = uVar15 + 1;
        } while ((uVar6 & 0x7fffffff) != uVar15);
      }
      pcVar16 = this->_outBuffer;
      if (this->_format == XDR) {
        uVar15 = local_48;
        if ((int)local_48 <= (int)b) {
          do {
            uVar6 = (uint)uVar15;
            if (0 < this->_numChans) {
              lVar23 = 0;
              do {
                pCVar21 = this->_channelData;
                uVar9 = pCVar21[lVar23].ys;
                if ((int)uVar6 < 0) {
                  if (-1 < (int)uVar9) {
                    uVar7 = (uVar9 + ~uVar6) / uVar9;
                    goto LAB_00408d57;
                  }
                  uVar7 = (~uVar9 - uVar6) / -uVar9;
                }
                else if ((int)uVar9 < 0) {
                  uVar7 = (uint)((uVar15 & 0xffffffff) / (ulong)-uVar9);
LAB_00408d57:
                  uVar7 = -uVar7;
                }
                else {
                  uVar7 = (uint)((uVar15 & 0xffffffff) / (ulong)uVar9);
                }
                if ((uVar6 == uVar7 * uVar9) &&
                   (iVar8 = pCVar21[lVar23].size * pCVar21[lVar23].nx, 0 < iVar8)) {
                  do {
                    pcVar22 = pcVar16;
                    local_62 = *pCVar21[lVar23].end;
                    lVar17 = 0;
                    do {
                      pcVar22[lVar17] = *(char *)((long)&local_62 + lVar17);
                      lVar17 = lVar17 + 1;
                    } while ((int)lVar17 != 2);
                    pCVar21[lVar23].end = pCVar21[lVar23].end + 1;
                    bVar2 = 1 < iVar8;
                    pcVar16 = pcVar22 + lVar17;
                    iVar8 = iVar8 + -1;
                  } while (bVar2);
                  pcVar16 = pcVar22 + lVar17;
                }
                lVar23 = lVar23 + 1;
              } while (lVar23 < this->_numChans);
            }
            uVar15 = (ulong)(uVar6 + 1);
          } while (uVar6 != b);
        }
      }
      else {
        uVar15 = local_48;
        if ((int)local_48 <= (int)b) {
          do {
            if (0 < this->_numChans) {
              local_60 = (unsigned_short *)(ulong)~(uint)uVar15;
              lVar17 = 8;
              lVar23 = 0;
              local_48 = uVar15;
              do {
                pCVar21 = this->_channelData;
                uVar6 = *(uint *)((long)&pCVar21->nx + lVar17);
                iVar8 = (int)uVar15;
                if (iVar8 < 0) {
                  if (-1 < (int)uVar6) {
                    uVar9 = ((int)local_60 + uVar6) / uVar6;
                    goto LAB_00408e6f;
                  }
                  uVar9 = (~uVar6 - iVar8) / -uVar6;
                }
                else if ((int)uVar6 < 0) {
                  uVar9 = (uint)((uVar15 & 0xffffffff) / (ulong)-uVar6);
LAB_00408e6f:
                  uVar9 = -uVar9;
                }
                else {
                  uVar9 = (uint)((uVar15 & 0xffffffff) / (ulong)uVar6);
                }
                if (iVar8 == uVar9 * uVar6) {
                  lVar20 = (long)*(int *)((long)&pCVar21->ny + lVar17) *
                           (long)*(int *)((long)&pCVar21->end + lVar17);
                  __n = lVar20 * 2;
                  memcpy(pcVar16,*(void **)((long)&pCVar21->start + lVar17),__n);
                  pcVar16 = pcVar16 + lVar20 * 2;
                  plVar1 = (long *)((long)&pCVar21->start + lVar17);
                  *plVar1 = *plVar1 + __n;
                  uVar15 = local_48;
                }
                lVar23 = lVar23 + 1;
                lVar17 = lVar17 + 0x20;
              } while (lVar23 < this->_numChans);
            }
            uVar6 = (uint)uVar15;
            uVar15 = (ulong)(uVar6 + 1);
          } while (uVar6 != b);
        }
      }
      *local_38 = this->_outBuffer;
      iVar8 = *(int *)&this->_outBuffer;
      operator_delete__(local_58);
      operator_delete__(local_50);
      return (int)pcVar16 - iVar8;
    }
    pcVar16 = "Error in header for PIZ-compressed data (invalid bitmap size).";
  }
  pIVar14 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(pIVar14,pcVar16);
  __cxa_throw(pIVar14,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

int
PizCompressor::uncompress (const char *inPtr,
			   int inSize,
			   IMATH_NAMESPACE::Box2i range,
			   const char *&outPtr)
{
    //
    // This is the cunompress function which is used by both the tiled and
    // scanline decompression routines.
    //
   
    const char* inputEnd=inPtr+inSize;

    //
    // Special case - empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }


    //
    // Determine the layout of the compressed pixel data
    //

    int minX = range.min.x;
    int maxX = range.max.x;
    int minY = range.min.y;
    int maxY = range.max.y;
    
    if (maxY > _maxY)
        maxY = _maxY;
    
    if (maxX > _maxX)
        maxX = _maxX;

    unsigned short *tmpBufferEnd = _tmpBuffer;
    int i = 0;

    for (ChannelList::ConstIterator c = _channels.begin();
	 c != _channels.end();
	 ++c, ++i)
    {
	ChannelData &cd = _channelData[i];

	cd.start = tmpBufferEnd;
	cd.end = cd.start;

	cd.nx = numSamples (c.channel().xSampling, minX, maxX);
	cd.ny = numSamples (c.channel().ySampling, minY, maxY);
	cd.ys = c.channel().ySampling;

	cd.size = pixelTypeSize (c.channel().type) / pixelTypeSize (HALF);

	tmpBufferEnd += cd.nx * cd.ny * cd.size;
    }

    //
    // Read range compression data
    //

    unsigned short minNonZero;
    unsigned short maxNonZero;

    AutoArray <unsigned char, BITMAP_SIZE> bitmap;
    memset (bitmap, 0, sizeof (unsigned char) * BITMAP_SIZE);


    if(inPtr + sizeof(unsigned short)*2 > inputEnd)
    {
   	   throw InputExc ("PIZ compressed data too short");
    }

    Xdr::read <CharPtrIO> (inPtr, minNonZero);
    Xdr::read <CharPtrIO> (inPtr, maxNonZero);

    if (maxNonZero >= BITMAP_SIZE)
    {
	throw InputExc ("Error in header for PIZ-compressed data "
			"(invalid bitmap size).");
    }

    if (minNonZero <= maxNonZero)
    {
        size_t bytesToRead = maxNonZero - minNonZero + 1;
	    if(inPtr + bytesToRead > inputEnd)
        {
   	      throw InputExc ("PIZ compressed data too short");
        }

Xdr::read <CharPtrIO> (inPtr, (char *) &bitmap[0] + minNonZero,
			       bytesToRead);
    }

    AutoArray <unsigned short, USHORT_RANGE> lut;
    unsigned short maxValue = reverseLutFromBitmap (bitmap, lut);

    //
    // Huffman decoding
    //
   if(inPtr + sizeof(int)> inputEnd)
   {
       throw InputExc ("PIZ compressed data too short");
   }


    int length;
    Xdr::read <CharPtrIO> (inPtr, length);

    if (length > inSize)
    {
	throw InputExc ("Error in header for PIZ-compressed data "
			"(invalid array length).");
    }

    hufUncompress (inPtr, length, _tmpBuffer, tmpBufferEnd - _tmpBuffer);

    //
    // Wavelet decoding
    //

    for (int i = 0; i < _numChans; ++i)
    {
	ChannelData &cd = _channelData[i];

	for (int j = 0; j < cd.size; ++j)
	{
	    wav2Decode (cd.start + j,
			cd.nx, cd.size,
			cd.ny, cd.nx * cd.size,
			maxValue);
	}
    }

    //
    // Expand the pixel data to their original range
    //

    applyLut (lut, _tmpBuffer, tmpBufferEnd - _tmpBuffer);
    
    //
    // Rearrange the pixel data into the format expected by the caller.
    //

    char *outEnd = _outBuffer;

    if (_format == XDR)
    {
	//
	// Machine-independent (Xdr) data format
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		for (int x = cd.nx * cd.size; x > 0; --x)
		{
		    Xdr::write <CharPtrIO> (outEnd, *cd.end);
		    ++cd.end;
		}
	    }
	}
    }
    else
    {
	//
	// Native, machine-dependent data format
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		int n = cd.nx * cd.size;
		memcpy (outEnd, cd.end, n * sizeof (unsigned short));
		outEnd += n * sizeof (unsigned short);
		cd.end += n;
	    }
	}
    }

    #if defined (DEBUG)

	for (int i = 1; i < _numChans; ++i)
	    assert (_channelData[i-1].end == _channelData[i].start);

	assert (_channelData[_numChans-1].end == tmpBufferEnd);

    #endif

    outPtr = _outBuffer;
    return outEnd - _outBuffer;
}